

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

Bool Ppmd7_Alloc(CPpmd7 *p,UInt32 size,ISzAlloc *alloc)

{
  Byte *pBVar1;
  ISzAlloc *alloc_local;
  UInt32 size_local;
  CPpmd7 *p_local;
  
  if ((p->Base == (Byte *)0x0) || (p->Size != size)) {
    Ppmd7_Free(p,alloc);
    p->AlignOffset = 4 - (size & 3);
    pBVar1 = (Byte *)(*alloc->Alloc)(alloc,(long)p->AlignOffset + (long)size + 0xc);
    p->Base = pBVar1;
    if (pBVar1 == (Byte *)0x0) {
      return 0;
    }
    p->Size = size;
  }
  return 1;
}

Assistant:

static Bool Ppmd7_Alloc(CPpmd7 *p, UInt32 size, ISzAlloc *alloc)
{
  if (p->Base == 0 || p->Size != size)
  {
    Ppmd7_Free(p, alloc);
    p->AlignOffset =
      #ifdef PPMD_32BIT
        (4 - size) & 3;
      #else
        4 - (size & 3);
      #endif
    if ((p->Base = (Byte *)alloc->Alloc(alloc, p->AlignOffset + size
        #ifndef PPMD_32BIT
        + UNIT_SIZE
        #endif
        )) == 0)
      return False;
    p->Size = size;
  }
  return True;
}